

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

uint32 __thiscall rw::Stream::write32(Stream *this,void *data,uint32 length)

{
  uint32 uVar1;
  uint32 length_local;
  void *data_local;
  Stream *this_local;
  
  uVar1 = (*this->_vptr_Stream[3])(this,data,(ulong)length);
  return uVar1;
}

Assistant:

uint32
Stream::write32(const void *data, uint32 length)
{
#ifdef BIGENDIAN
	uint8 *src = (uint8*)data;
	uint32 buf[256];
	int32 n, len;
	for(len = length >>= 2; len > 0; len -= 256){
		n = len < 256 ? len : 256;
		memcpy(buf, src, n*4);
		memLittle32(buf, n*4);
		write8(buf, n*4);
		src += n*4;
	}
	return length;
#else
	return write8(data, length);
#endif
}